

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O3

int teardown_roaring_add_offset_test(void **state_)

{
  void *pvVar1;
  
  pvVar1 = *state_;
  if (*(roaring_bitmap_t **)((long)pvVar1 + 0x20) != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)pvVar1 + 0x20));
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
  }
  if (*(roaring_bitmap_t **)((long)pvVar1 + 0x28) != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)pvVar1 + 0x28));
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  }
  if (*(roaring_bitmap_t **)((long)pvVar1 + 0x30) != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)pvVar1 + 0x30));
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  }
  if (*(roaring_bitmap_t **)((long)pvVar1 + 0x38) != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)pvVar1 + 0x38));
    *(undefined8 *)((long)pvVar1 + 0x38) = 0;
  }
  if (*(roaring_bitmap_t **)((long)pvVar1 + 0x40) != (roaring_bitmap_t *)0x0) {
    roaring_bitmap_free(*(roaring_bitmap_t **)((long)pvVar1 + 0x40));
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int teardown_roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    if (state->in) {
        roaring_bitmap_free(state->in);
        state->in = NULL;
    }
    if (state->forward) {
        roaring_bitmap_free(state->forward);
        state->forward = NULL;
    }
    if (state->back) {
        roaring_bitmap_free(state->back);
        state->back = NULL;
    }
    if (state->neg_forward) {
        roaring_bitmap_free(state->neg_forward);
        state->neg_forward = NULL;
    }
    if (state->neg_back) {
        roaring_bitmap_free(state->neg_back);
        state->neg_back = NULL;
    }

    return 0;
}